

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_stream_capture.hpp
# Opt level: O0

string * __thiscall
iutest::detail::IUStreamCapture::GetStreamString_abi_cxx11_
          (string *__return_storage_ptr__,IUStreamCapture *this)

{
  bool bVar1;
  iu_stringstream *piVar2;
  ostream *poVar3;
  string *psVar4;
  allocator<char> local_1b5 [13];
  IUTestLog local_1a8;
  IUStreamCapture *local_18;
  IUStreamCapture *this_local;
  
  local_18 = this;
  this_local = (IUStreamCapture *)__return_storage_ptr__;
  bVar1 = TempFile::Open(&this->m_tempfile,1);
  if (bVar1) {
    IInStream::ReadAll_abi_cxx11_
              (__return_storage_ptr__,&(this->m_tempfile).super_IFile.super_IInStream);
  }
  else {
    IUTestLog::IUTestLog
              (&local_1a8,LOG_WARNING,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_stream_capture.hpp"
               ,0x45);
    piVar2 = IUTestLog::GetStream_abi_cxx11_(&local_1a8);
    poVar3 = std::operator<<((ostream *)&piVar2->field_0x10,"temp file open failed: ");
    psVar4 = TempFile::GetFileName_abi_cxx11_(&this->m_tempfile);
    std::operator<<(poVar3,(string *)psVar4);
    IUTestLog::~IUTestLog(&local_1a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",local_1b5);
    std::allocator<char>::~allocator(local_1b5);
  }
  return __return_storage_ptr__;
}

Assistant:

::std::string GetStreamString()
    {
        if( !m_tempfile.Open(iutest::IFile::OpenRead) )
        {
            IUTEST_LOG_(WARNING) << "temp file open failed: " << m_tempfile.GetFileName();
            return "";
        }
        return m_tempfile.ReadAll();
    }